

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O3

REF_STATUS
ref_search_selection(REF_MPI ref_mpi,REF_INT n,REF_DBL *elements,REF_LONG position,REF_DBL *value)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  double dVar6;
  REF_LONG count;
  REF_LONG high_pos;
  REF_DBL temp;
  double local_70;
  double local_68;
  double local_60;
  long local_58;
  double local_50;
  long local_48;
  double *local_40;
  double local_38;
  
  local_48 = (long)n;
  uVar1 = ref_mpi_allsum(ref_mpi,&local_48,1,2);
  if (uVar1 == 0) {
    local_48 = local_48 + -1;
    if (n < 1) {
      local_68 = 1e+200;
      local_70 = -1e+200;
    }
    else {
      local_70 = -1e+200;
      local_68 = 1e+200;
      uVar2 = 0;
      do {
        dVar6 = elements[uVar2];
        if (dVar6 <= local_68) {
          local_68 = dVar6;
        }
        if (local_70 <= dVar6) {
          local_70 = dVar6;
        }
        uVar2 = uVar2 + 1;
      } while ((uint)n != uVar2);
    }
    local_60 = local_70;
    local_38 = local_68;
    uVar1 = ref_mpi_min(ref_mpi,&local_38,&local_68,3);
    if (uVar1 == 0) {
      uVar1 = ref_mpi_bcast(ref_mpi,&local_68,1,3);
      if (uVar1 == 0) {
        local_38 = local_60;
        uVar1 = ref_mpi_max(ref_mpi,&local_38,&local_70,3);
        if (uVar1 == 0) {
          uVar1 = ref_mpi_bcast(ref_mpi,&local_70,1,3);
          if (uVar1 == 0) {
            dVar6 = local_68;
            if ((position < 1) || (dVar6 = local_70, local_48 <= position)) {
              *value = dVar6;
            }
            else {
              uVar1 = 0;
              local_40 = value;
              do {
                local_60 = (double)(ulong)uVar1;
                local_50 = (local_68 + local_70) * 0.5;
                local_58 = 0;
                if (0 < n) {
                  uVar2 = 0;
                  lVar3 = 0;
                  do {
                    if (elements[uVar2] <= local_50) {
                      lVar3 = lVar3 + 1;
                      local_58 = lVar3;
                    }
                    uVar2 = uVar2 + 1;
                  } while ((uint)n != uVar2);
                }
                uVar1 = ref_mpi_allsum(ref_mpi,&local_58,1,2);
                if (uVar1 != 0) {
                  pcVar5 = "bcast";
                  uVar4 = 0x1bc;
                  goto LAB_0019dc03;
                }
                if (position < local_58) {
                  local_70 = local_50;
                }
                else {
                  local_68 = local_50;
                }
                uVar1 = SUB84(local_60,0) + 1;
              } while (uVar1 != 0x28);
              *local_40 = local_50;
            }
            return 0;
          }
          pcVar5 = "bcast";
          uVar4 = 0x1a8;
        }
        else {
          pcVar5 = "max";
          uVar4 = 0x1a7;
        }
      }
      else {
        pcVar5 = "bcast";
        uVar4 = 0x1a5;
      }
    }
    else {
      pcVar5 = "min";
      uVar4 = 0x1a4;
    }
  }
  else {
    pcVar5 = "high_pos";
    uVar4 = 0x19b;
  }
LAB_0019dc03:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",uVar4,
         "ref_search_selection",(ulong)uVar1,pcVar5);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_search_selection(REF_MPI ref_mpi, REF_INT n,
                                        REF_DBL *elements, REF_LONG position,
                                        REF_DBL *value) {
  REF_INT i, bisection;
  REF_LONG low_pos, high_pos, count;
  REF_DBL low_val, high_val, temp, mid_val;
  low_pos = 0;
  high_pos = (REF_LONG)n;
  RSS(ref_mpi_allsum(ref_mpi, &high_pos, 1, REF_LONG_TYPE), "high_pos");
  high_pos--;
  low_val = REF_DBL_MAX;
  high_val = REF_DBL_MIN;
  for (i = 0; i < n; i++) {
    low_val = MIN(low_val, elements[i]);
    high_val = MAX(high_val, elements[i]);
  }
  temp = low_val;
  RSS(ref_mpi_min(ref_mpi, &temp, &low_val, REF_DBL_TYPE), "min");
  RSS(ref_mpi_bcast(ref_mpi, &low_val, 1, REF_DBL_TYPE), "bcast");
  temp = high_val;
  RSS(ref_mpi_max(ref_mpi, &temp, &high_val, REF_DBL_TYPE), "max");
  RSS(ref_mpi_bcast(ref_mpi, &high_val, 1, REF_DBL_TYPE), "bcast");

  if (position <= low_pos) {
    *value = low_val;
    return REF_SUCCESS;
  }

  if (position >= high_pos) {
    *value = high_val;
    return REF_SUCCESS;
  }

  mid_val = 0.5 * (low_val + high_val); /* ensure initialized */
  for (bisection = 0; bisection < 40; bisection++) {
    mid_val = 0.5 * (low_val + high_val);
    count = 0;
    for (i = 0; i < n; i++) {
      if (elements[i] <= mid_val) count++;
    }

    RSS(ref_mpi_allsum(ref_mpi, &count, 1, REF_LONG_TYPE), "bcast");
    /* printf("pos  %ld %ld %ld val %f %f %f\n",
               low_pos, count, high_pos, low_val,
               mid_val, high_val);*/
    if (count - 1 < position) {
      low_val = mid_val;
    } else {
      high_val = mid_val;
    }
  }
  *value = mid_val;
  return REF_SUCCESS;
}